

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::ruby::DefaultValueForField_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int32_t value;
  uint32_t value_00;
  int value_01;
  Type TVar3;
  _Setw _Var4;
  int64_t value_02;
  uint64_t value_03;
  char *pcVar5;
  EnumValueDescriptor *this_00;
  string *psVar6;
  ostream *poVar7;
  ulong uVar8;
  byte *pbVar9;
  float value_04;
  double value_05;
  int local_1cc;
  string local_1c8 [4];
  int i;
  string default_str;
  ostringstream os;
  allocator local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  switch(CVar2) {
  case CPPTYPE_INT32:
    value = FieldDescriptor::default_value_int32(local_18);
    NumberToString<int>(__return_storage_ptr__,value);
    break;
  case CPPTYPE_INT64:
    value_02 = FieldDescriptor::default_value_int64(local_18);
    NumberToString<long>(__return_storage_ptr__,value_02);
    break;
  case CPPTYPE_UINT32:
    value_00 = FieldDescriptor::default_value_uint32(local_18);
    NumberToString<unsigned_int>(__return_storage_ptr__,value_00);
    break;
  case CPPTYPE_UINT64:
    value_03 = FieldDescriptor::default_value_uint64(local_18);
    NumberToString<unsigned_long>(__return_storage_ptr__,value_03);
    break;
  case CPPTYPE_DOUBLE:
    value_05 = FieldDescriptor::default_value_double(local_18);
    NumberToString<double>(__return_storage_ptr__,value_05);
    break;
  case CPPTYPE_FLOAT:
    value_04 = FieldDescriptor::default_value_float(local_18);
    NumberToString<float>(__return_storage_ptr__,value_04);
    break;
  case CPPTYPE_BOOL:
    bVar1 = FieldDescriptor::default_value_bool(local_18);
    pcVar5 = "false";
    if (bVar1) {
      pcVar5 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case CPPTYPE_ENUM:
    this_00 = FieldDescriptor::default_value_enum(local_18);
    value_01 = EnumValueDescriptor::number(this_00);
    NumberToString<int>(__return_storage_ptr__,value_01);
    break;
  case CPPTYPE_STRING:
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)(default_str.field_2._M_local_buf + 8));
    psVar6 = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
    std::__cxx11::string::string(local_1c8,(string *)psVar6);
    TVar3 = FieldDescriptor::type(local_18);
    if (TVar3 == TYPE_STRING) {
      poVar7 = std::operator<<((ostream *)(default_str.field_2._M_local_buf + 8),"\"");
      poVar7 = std::operator<<(poVar7,local_1c8);
      std::operator<<(poVar7,"\"");
    }
    else {
      TVar3 = FieldDescriptor::type(local_18);
      if (TVar3 == TYPE_BYTES) {
        std::operator<<((ostream *)(default_str.field_2._M_local_buf + 8),"\"");
        std::ios::fill((char)&default_str + '\x18' +
                       (char)*(undefined8 *)(default_str.field_2._8_8_ + -0x18));
        for (local_1cc = 0; uVar8 = std::__cxx11::string::length(), (ulong)(long)local_1cc < uVar8;
            local_1cc = local_1cc + 1) {
          poVar7 = std::operator<<((ostream *)(default_str.field_2._M_local_buf + 8),"\\x");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
          _Var4 = std::setw(2);
          poVar7 = std::operator<<(poVar7,_Var4);
          pbVar9 = (byte *)std::__cxx11::string::at((ulong)local_1c8);
          std::ostream::operator<<(poVar7,(ushort)*pbVar9);
        }
        std::operator<<((ostream *)(default_str.field_2._M_local_buf + 8),
                        "\".force_encoding(\"ASCII-8BIT\")");
      }
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)(default_str.field_2._M_local_buf + 8));
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                  ,0xa8,
                  "std::string google::protobuf::compiler::ruby::DefaultValueForField(const FieldDescriptor *)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValueForField(const FieldDescriptor* field) {
  switch(field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return NumberToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_INT64:
      return NumberToString(field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT32:
      return NumberToString(field->default_value_uint32());
    case FieldDescriptor::CPPTYPE_UINT64:
      return NumberToString(field->default_value_uint64());
    case FieldDescriptor::CPPTYPE_FLOAT:
      return NumberToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return NumberToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      return NumberToString(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_STRING: {
      std::ostringstream os;
      std::string default_str = field->default_value_string();

      if (field->type() == FieldDescriptor::TYPE_STRING) {
        os << "\"" << default_str << "\"";
      } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
        os << "\"";

        os.fill('0');
        for (int i = 0; i < default_str.length(); ++i) {
          // Write the hex form of each byte.
          os << "\\x" << std::hex << std::setw(2)
             << ((uint16)((unsigned char)default_str.at(i)));
        }
        os << "\".force_encoding(\"ASCII-8BIT\")";
      }

      return os.str();
    }
    default: assert(false); return "";
  }
}